

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O3

int webrtc::WebRtcAec_InitAec(AecCore *aec,int sampFreq)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar9;
  
  aec->sampFreq = sampFreq;
  if (aec->refined_adaptive_filter_enabled == false) {
    if (aec->extended_filter_enabled != 0) {
      aec->filter_step_size = 0.4;
      goto LAB_00162041;
    }
    if (sampFreq == 8000) {
      aec->filter_step_size = 0.6;
      goto LAB_00162073;
    }
    aec->filter_step_size = 0.5;
LAB_0016208a:
    aec->error_threshold = 1.5e-06;
  }
  else {
    aec->filter_step_size = 0.05;
    if (aec->extended_filter_enabled == 0) {
      if (sampFreq == 8000) {
LAB_00162073:
        aec->error_threshold = 2e-06;
        sVar3 = 1;
        goto LAB_001620a9;
      }
      goto LAB_0016208a;
    }
LAB_00162041:
    aec->error_threshold = 1e-06;
    sVar3 = 1;
    if (sampFreq == 8000) goto LAB_001620a9;
  }
  sVar3 = (size_t)(sampFreq / 16000);
LAB_001620a9:
  aec->num_bands = sVar3;
  WebRtc_InitBuffer(aec->nearFrBuf);
  WebRtc_InitBuffer(aec->outFrBuf);
  WebRtc_InitBuffer(aec->nearFrBufH[0]);
  WebRtc_InitBuffer(aec->outFrBufH[0]);
  WebRtc_InitBuffer(aec->nearFrBufH[1]);
  WebRtc_InitBuffer(aec->outFrBufH[1]);
  WebRtc_InitBuffer(aec->far_time_buf);
  aec->system_delay = 0;
  iVar2 = WebRtc_InitDelayEstimatorFarend(aec->delay_estimator_farend);
  iVar6 = -1;
  if ((iVar2 == 0) && (iVar2 = WebRtc_InitDelayEstimator(aec->delay_estimator), iVar2 == 0)) {
    aec->delay_logging_enabled = 0;
    memset(&aec->delay_metrics_delivered,0,0x1fc);
    aec->delay_median = -1;
    aec->delay_std = -1;
    aec->fraction_poor_delays = -1.0;
    aec->signal_delay_correction = 0;
    aec->previous_delay = -2;
    aec->delay_correction_count = 0;
    aec->shift_offset = 5;
    aec->delay_quality_threshold = 0.01;
    aec->num_partitions = 0xc;
    WebRtc_set_allowed_offset(aec->delay_estimator,6);
    WebRtc_enable_robust_validation(aec->delay_estimator,1);
    aec->frame_count = 0;
    aec->nlp_mode = 1;
    iVar2 = 2;
    if (aec->num_bands < 2) {
      iVar2 = (int)(short)aec->sampFreq;
      uVar5 = ((uint)(iVar2 * -0x7ced) >> 0x10) + iVar2;
      iVar2 = (int)(short)(((short)uVar5 >> 0xc) + (short)((uVar5 & 0xffff) >> 0xf));
    }
    aec->mult = iVar2;
    memset(aec->dInitMinPow,0,0x104);
    aec->farBufWritePos = 0;
    aec->farBufReadPos = 0;
    aec->knownDelay = 0;
    aec->inSamples = 0;
    aec->outSamples = 0;
    memset(aec->dBuf,0,0xa08);
    aec->noisePow = aec->dInitMinPow;
    aec->noiseEstCtr = 0;
    auVar1 = _DAT_0019c620;
    lVar4 = 0x297;
    auVar7 = _DAT_0019dd40;
    auVar10 = _DAT_0019dd50;
    do {
      auVar13 = auVar10 ^ auVar1;
      if (auVar13._4_4_ == -0x80000000 && auVar13._0_4_ < -0x7fffffbf) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x34) = 0x49742400;
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x30) = 0x49742400;
      }
      auVar13 = auVar7 ^ auVar1;
      if (auVar13._4_4_ == -0x80000000 && auVar13._0_4_ < -0x7fffffbf) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x2c) = 0x49742400;
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x28) = 0x49742400;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar9 + 4;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x2db);
    aec->xfBufBlockPos = 0;
    memset(aec->se,0,0x104);
    memset(aec->xfBuf,0,0xc710);
    auVar1 = _DAT_0019c620;
    lVar4 = 0x3520;
    auVar13 = _DAT_0019dd40;
    auVar11 = _DAT_0019dd50;
    do {
      if (SUB164(auVar11 ^ auVar1,4) == -0x80000000 && SUB164(auVar11 ^ auVar1,0) < -0x7fffffbf) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x34) = 0x3f800000;
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x30) = 0x3f800000;
      }
      if (SUB164(auVar13 ^ auVar1,4) == -0x80000000 && SUB164(auVar13 ^ auVar1,0) < -0x7fffffbf) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x2c) = 0x3f800000;
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x28) = 0x3f800000;
      }
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar9 + 4;
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar9 + 4;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x3564);
    lVar4 = 0x34df;
    auVar8 = _DAT_0019dd40;
    auVar12 = _DAT_0019dd50;
    do {
      if (SUB164(auVar12 ^ auVar1,4) == -0x80000000 && SUB164(auVar12 ^ auVar1,0) < -0x7fffffbf) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x34) = 0x3f800000;
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x30) = 0x3f800000;
      }
      if (SUB164(auVar8 ^ auVar1,4) == -0x80000000 && SUB164(auVar8 ^ auVar1,0) < -0x7fffffbf) {
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x2c) = 0x3f800000;
        *(undefined4 *)((long)aec->nearFrBufH + lVar4 * 4 + -0x28) = 0x3f800000;
      }
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x3523);
    iVar6 = 0;
    memset(aec->hNs,0,0x104);
    memset(aec->outBuf,0,0x100);
    aec->hNlFbMin = 1.0;
    aec->hNlFbLocalMin = 1.0;
    aec->hNlXdAvgMin = 1.0;
    aec->hNlNewMin = 0;
    aec->hNlMinCtr = 0;
    aec->overDrive = 2.0;
    aec->overDriveSm = 2.0;
    aec->delayIdx = 0;
    aec->stNearState = 0;
    aec->echoState = 0;
    aec->divergeState = 0;
    aec->seed = 0x309;
    aec->delayEstCtr = 0;
    aec->extreme_filter_divergence = 0;
    aec->metricsMode = 0;
    InitMetrics(aec);
  }
  return iVar6;
}

Assistant:

int WebRtcAec_InitAec(AecCore* aec, int sampFreq) {
  int i;

  aec->sampFreq = sampFreq;

  SetAdaptiveFilterStepSize(aec);
  SetErrorThreshold(aec);

  if (sampFreq == 8000) {
    aec->num_bands = 1;
  } else {
    aec->num_bands = (size_t)(sampFreq / 16000);
  }

  WebRtc_InitBuffer(aec->nearFrBuf);
  WebRtc_InitBuffer(aec->outFrBuf);
  for (i = 0; i < NUM_HIGH_BANDS_MAX; ++i) {
    WebRtc_InitBuffer(aec->nearFrBufH[i]);
    WebRtc_InitBuffer(aec->outFrBufH[i]);
  }

  // Initialize far-end buffers.
  WebRtc_InitBuffer(aec->far_time_buf);

#ifdef WEBRTC_AEC_DEBUG_DUMP
  {
    int process_rate = sampFreq > 16000 ? 16000 : sampFreq;
    RTC_AEC_DEBUG_WAV_REOPEN("aec_far", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->farFile);
    RTC_AEC_DEBUG_WAV_REOPEN("aec_near", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->nearFile);
    RTC_AEC_DEBUG_WAV_REOPEN("aec_out", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->outFile);
    RTC_AEC_DEBUG_WAV_REOPEN("aec_out_linear", aec->instance_index,
                             aec->debug_dump_count, process_rate,
                             &aec->outLinearFile);
  }

  RTC_AEC_DEBUG_RAW_OPEN("aec_e_fft", aec->debug_dump_count, &aec->e_fft_file);

  ++aec->debug_dump_count;
#endif
  aec->system_delay = 0;

  if (WebRtc_InitDelayEstimatorFarend(aec->delay_estimator_farend) != 0) {
    return -1;
  }
  if (WebRtc_InitDelayEstimator(aec->delay_estimator) != 0) {
    return -1;
  }
  aec->delay_logging_enabled = 0;
  aec->delay_metrics_delivered = 0;
  memset(aec->delay_histogram, 0, sizeof(aec->delay_histogram));
  aec->num_delay_values = 0;
  aec->delay_median = -1;
  aec->delay_std = -1;
  aec->fraction_poor_delays = -1.0f;

  aec->signal_delay_correction = 0;
  aec->previous_delay = -2;  // (-2): Uninitialized.
  aec->delay_correction_count = 0;
  aec->shift_offset = kInitialShiftOffset;
  aec->delay_quality_threshold = kDelayQualityThresholdMin;

  aec->num_partitions = kNormalNumPartitions;

  // Update the delay estimator with filter length.  We use half the
  // |num_partitions| to take the echo path into account.  In practice we say
  // that the echo has a duration of maximum half |num_partitions|, which is not
  // true, but serves as a crude measure.
  WebRtc_set_allowed_offset(aec->delay_estimator, aec->num_partitions / 2);
  // TODO(bjornv): I currently hard coded the enable.  Once we've established
  // that AECM has no performance regression, robust_validation will be enabled
  // all the time and the APIs to turn it on/off will be removed.  Hence, remove
  // this line then.
  WebRtc_enable_robust_validation(aec->delay_estimator, 1);
  aec->frame_count = 0;

  // Default target suppression mode.
  aec->nlp_mode = 1;

  // Sampling frequency multiplier w.r.t. 8 kHz.
  // In case of multiple bands we process the lower band in 16 kHz, hence the
  // multiplier is always 2.
  if (aec->num_bands > 1) {
    aec->mult = 2;
  } else {
    aec->mult = static_cast<int16_t>(aec->sampFreq) / 8000;
  }

  aec->farBufWritePos = 0;
  aec->farBufReadPos = 0;

  aec->inSamples = 0;
  aec->outSamples = 0;
  aec->knownDelay = 0;

  // Initialize buffers
  memset(aec->dBuf, 0, sizeof(aec->dBuf));
  memset(aec->eBuf, 0, sizeof(aec->eBuf));
  // For H bands
  for (i = 0; i < NUM_HIGH_BANDS_MAX; ++i) {
    memset(aec->dBufH[i], 0, sizeof(aec->dBufH[i]));
  }

  memset(aec->xPow, 0, sizeof(aec->xPow));
  memset(aec->dPow, 0, sizeof(aec->dPow));
  memset(aec->dInitMinPow, 0, sizeof(aec->dInitMinPow));
  aec->noisePow = aec->dInitMinPow;
  aec->noiseEstCtr = 0;

  // Initial comfort noise power
  for (i = 0; i < PART_LEN1; i++) {
    aec->dMinPow[i] = 1.0e6f;
  }

  // Holds the last block written to
  aec->xfBufBlockPos = 0;
  // TODO(peah): Investigate need for these initializations. Deleting them
  // doesn't change the output at all and yields 0.4% overall speedup.
  memset(aec->xfBuf, 0, sizeof(complex_t) * kExtendedNumPartitions * PART_LEN1);
  memset(aec->wfBuf, 0, sizeof(complex_t) * kExtendedNumPartitions * PART_LEN1);
  memset(aec->sde, 0, sizeof(complex_t) * PART_LEN1);
  memset(aec->sxd, 0, sizeof(complex_t) * PART_LEN1);
  memset(aec->xfwBuf, 0,
         sizeof(complex_t) * kExtendedNumPartitions * PART_LEN1);
  memset(aec->se, 0, sizeof(float) * PART_LEN1);

  // To prevent numerical instability in the first block.
  for (i = 0; i < PART_LEN1; i++) {
    aec->sd[i] = 1;
  }
  for (i = 0; i < PART_LEN1; i++) {
    aec->sx[i] = 1;
  }

  memset(aec->hNs, 0, sizeof(aec->hNs));
  memset(aec->outBuf, 0, sizeof(float) * PART_LEN);

  aec->hNlFbMin = 1;
  aec->hNlFbLocalMin = 1;
  aec->hNlXdAvgMin = 1;
  aec->hNlNewMin = 0;
  aec->hNlMinCtr = 0;
  aec->overDrive = 2;
  aec->overDriveSm = 2;
  aec->delayIdx = 0;
  aec->stNearState = 0;
  aec->echoState = 0;
  aec->divergeState = 0;

  aec->seed = 777;
  aec->delayEstCtr = 0;

  aec->extreme_filter_divergence = 0;

  // Metrics disabled by default
  aec->metricsMode = 0;
  InitMetrics(aec);

  return 0;
}